

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

void google::protobuf::internal::ReflectionOps::Merge(Message *from,Message *to)

{
  long lVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  LogMessage *pLVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  undefined8 uVar10;
  UnknownFieldSet *this;
  UnknownFieldSet *other;
  ulong uVar11;
  long lVar12;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  void *local_88;
  void *pvStack_80;
  long local_78;
  LogMessage local_70;
  ulong local_38;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if (from == to) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/reflection_ops.cc"
               ,0x37);
    pLVar6 = LogMessage::operator<<(&local_70,"CHECK failed: (&from) != (to): ");
    LogFinisher::operator=((LogFinisher *)&local_88,pLVar6);
    LogMessage::~LogMessage(&local_70);
  }
  iVar3 = (*(from->super_MessageLite)._vptr_MessageLite[0x13])();
  iVar4 = (*(to->super_MessageLite)._vptr_MessageLite[0x13])();
  if (CONCAT44(extraout_var_00,iVar4) != CONCAT44(extraout_var,iVar3)) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/reflection_ops.cc"
               ,0x3a);
    pLVar6 = LogMessage::operator<<
                       (&local_70,"CHECK failed: (to->GetDescriptor()) == (descriptor): ");
    pLVar6 = LogMessage::operator<<(pLVar6,"Tried to merge messages of different types.");
    LogFinisher::operator=((LogFinisher *)&local_88,pLVar6);
    LogMessage::~LogMessage(&local_70);
  }
  iVar3 = (*(from->super_MessageLite)._vptr_MessageLite[0x12])(from);
  plVar7 = (long *)CONCAT44(extraout_var_01,iVar3);
  iVar3 = (*(to->super_MessageLite)._vptr_MessageLite[0x12])();
  plVar8 = (long *)CONCAT44(extraout_var_02,iVar3);
  local_88 = (void *)0x0;
  pvStack_80 = (void *)0x0;
  local_78 = 0;
  (**(code **)(*plVar7 + 0x60))(plVar7,from);
  if (pvStack_80 != local_88) {
    uVar11 = 0;
    do {
      lVar1 = *(long *)((long)local_88 + uVar11 * 8);
      local_38 = uVar11;
      if (*(int *)(lVar1 + 0x30) == 3) {
        iVar3 = (**(code **)(*plVar7 + 0x30))(plVar7,from,lVar1);
        if (0 < iVar3) {
          iVar4 = 0;
          do {
            switch(*(undefined4 *)
                    (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar1 + 0x2c) * 4)) {
            case 1:
              uVar5 = (**(code **)(*plVar7 + 0x118))(plVar7,from,lVar1,iVar4);
              lVar12 = 0x1c0;
              goto LAB_0021aad8;
            case 2:
              uVar10 = (**(code **)(*plVar7 + 0x120))(plVar7,from,lVar1,iVar4);
              lVar12 = 0x1c8;
              goto LAB_0021ab60;
            case 3:
              uVar5 = (**(code **)(*plVar7 + 0x128))(plVar7,from,lVar1,iVar4);
              lVar12 = 0x1d0;
LAB_0021aad8:
              (**(code **)(*plVar8 + lVar12))(plVar8,to,lVar1,uVar5);
              break;
            case 4:
              uVar10 = (**(code **)(*plVar7 + 0x130))(plVar7,from,lVar1,iVar4);
              lVar12 = 0x1d8;
LAB_0021ab60:
              (**(code **)(*plVar8 + lVar12))(plVar8,to,lVar1,uVar10);
              break;
            case 5:
              (**(code **)(*plVar7 + 0x140))(plVar7,from,lVar1,iVar4);
              (**(code **)(*plVar8 + 0x1e8))(plVar8,to,lVar1);
              break;
            case 6:
              (**(code **)(*plVar7 + 0x138))(plVar7,from,lVar1,iVar4);
              (**(code **)(*plVar8 + 0x1e0))(plVar8,to,lVar1);
              break;
            case 7:
              uVar2 = (**(code **)(*plVar7 + 0x148))(plVar7,from,lVar1,iVar4);
              (**(code **)(*plVar8 + 0x1f0))(plVar8,to,lVar1,uVar2);
              break;
            case 8:
              uVar10 = (**(code **)(*plVar7 + 0x158))(plVar7,from,lVar1,iVar4);
              (**(code **)(*plVar8 + 0x200))(plVar8,to,lVar1,uVar10);
              break;
            case 9:
              (**(code **)(*plVar7 + 0x150))(&local_70,plVar7,from,lVar1,iVar4);
              (**(code **)(*plVar8 + 0x1f8))(plVar8,to,lVar1,&local_70);
              if (local_70._0_8_ != (long)&local_70 + 0x10U) {
                operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
              }
              break;
            case 10:
              plVar9 = (long *)(**(code **)(*plVar8 + 0x208))(plVar8,to,lVar1,0);
              uVar10 = (**(code **)(*plVar7 + 0x160))(plVar7,from,lVar1,iVar4);
              (**(code **)(*plVar9 + 0x70))(plVar9,uVar10);
            }
            iVar4 = iVar4 + 1;
          } while (iVar3 != iVar4);
        }
        goto switchD_0021ac65_default;
      }
      switch(*(undefined4 *)
              (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar1 + 0x2c) * 4)) {
      case 1:
        uVar5 = (**(code **)(*plVar7 + 0x68))(plVar7,from,lVar1);
        lVar12 = 0xc0;
        goto LAB_0021ad05;
      case 2:
        uVar10 = (**(code **)(*plVar7 + 0x70))(plVar7,from,lVar1);
        lVar12 = 200;
        goto LAB_0021ad81;
      case 3:
        uVar5 = (**(code **)(*plVar7 + 0x78))(plVar7,from,lVar1);
        lVar12 = 0xd0;
LAB_0021ad05:
        (**(code **)(*plVar8 + lVar12))(plVar8,to,lVar1,uVar5);
        break;
      case 4:
        uVar10 = (**(code **)(*plVar7 + 0x80))(plVar7,from,lVar1);
        lVar12 = 0xd8;
LAB_0021ad81:
        (**(code **)(*plVar8 + lVar12))(plVar8,to,lVar1,uVar10);
        break;
      case 5:
        (**(code **)(*plVar7 + 0x90))(plVar7,from,lVar1);
        (**(code **)(*plVar8 + 0xe8))(plVar8,to,lVar1);
        break;
      case 6:
        (**(code **)(*plVar7 + 0x88))(plVar7,from,lVar1);
        (**(code **)(*plVar8 + 0xe0))(plVar8,to,lVar1);
        break;
      case 7:
        uVar2 = (**(code **)(*plVar7 + 0x98))(plVar7,from,lVar1);
        (**(code **)(*plVar8 + 0xf0))(plVar8,to,lVar1,uVar2);
        break;
      case 8:
        uVar10 = (**(code **)(*plVar7 + 0xa8))(plVar7,from,lVar1);
        (**(code **)(*plVar8 + 0x100))(plVar8,to,lVar1,uVar10);
        break;
      case 9:
        (**(code **)(*plVar7 + 0xa0))(&local_70,plVar7,from,lVar1);
        (**(code **)(*plVar8 + 0xf8))(plVar8,to,lVar1,&local_70);
        if (local_70._0_8_ != (long)&local_70 + 0x10U) {
          operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
        }
        break;
      case 10:
        plVar9 = (long *)(**(code **)(*plVar8 + 0x108))(plVar8,to,lVar1,0);
        uVar10 = (**(code **)(*plVar7 + 0xb0))(plVar7,from,lVar1,0);
        (**(code **)(*plVar9 + 0x70))(plVar9,uVar10);
      }
switchD_0021ac65_default:
      uVar11 = local_38 + 1;
    } while (uVar11 < (ulong)((long)pvStack_80 - (long)local_88 >> 3));
  }
  this = (UnknownFieldSet *)(**(code **)(*plVar8 + 0x18))(plVar8,to);
  other = (UnknownFieldSet *)(**(code **)(*plVar7 + 0x10))(plVar7,from);
  UnknownFieldSet::MergeFrom(this,other);
  if (local_88 != (void *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  return;
}

Assistant:

void ReflectionOps::Merge(const Message& from, Message* to) {
  GOOGLE_CHECK_NE(&from, to);

  const Descriptor* descriptor = from.GetDescriptor();
  GOOGLE_CHECK_EQ(to->GetDescriptor(), descriptor)
    << "Tried to merge messages of different types.";

  const Reflection* from_reflection = from.GetReflection();
  const Reflection* to_reflection = to->GetReflection();

  vector<const FieldDescriptor*> fields;
  from_reflection->ListFields(from, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];

    if (field->is_repeated()) {
      int count = from_reflection->FieldSize(from, field);
      for (int j = 0; j < count; j++) {
        switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                     \
          case FieldDescriptor::CPPTYPE_##CPPTYPE:                       \
            to_reflection->Add##METHOD(to, field,                        \
              from_reflection->GetRepeated##METHOD(from, field, j));     \
            break;

          HANDLE_TYPE(INT32 , Int32 );
          HANDLE_TYPE(INT64 , Int64 );
          HANDLE_TYPE(UINT32, UInt32);
          HANDLE_TYPE(UINT64, UInt64);
          HANDLE_TYPE(FLOAT , Float );
          HANDLE_TYPE(DOUBLE, Double);
          HANDLE_TYPE(BOOL  , Bool  );
          HANDLE_TYPE(STRING, String);
          HANDLE_TYPE(ENUM  , Enum  );
#undef HANDLE_TYPE

          case FieldDescriptor::CPPTYPE_MESSAGE:
            to_reflection->AddMessage(to, field)->MergeFrom(
              from_reflection->GetRepeatedMessage(from, field, j));
            break;
        }
      }
    } else {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                        \
        case FieldDescriptor::CPPTYPE_##CPPTYPE:                            \
          to_reflection->Set##METHOD(to, field,                             \
            from_reflection->Get##METHOD(from, field));                     \
          break;

        HANDLE_TYPE(INT32 , Int32 );
        HANDLE_TYPE(INT64 , Int64 );
        HANDLE_TYPE(UINT32, UInt32);
        HANDLE_TYPE(UINT64, UInt64);
        HANDLE_TYPE(FLOAT , Float );
        HANDLE_TYPE(DOUBLE, Double);
        HANDLE_TYPE(BOOL  , Bool  );
        HANDLE_TYPE(STRING, String);
        HANDLE_TYPE(ENUM  , Enum  );
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_MESSAGE:
          to_reflection->MutableMessage(to, field)->MergeFrom(
            from_reflection->GetMessage(from, field));
          break;
      }
    }
  }

  to_reflection->MutableUnknownFields(to)->MergeFrom(
    from_reflection->GetUnknownFields(from));
}